

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.h
# Opt level: O0

void __thiscall ReachableNets::ReachableNets(ReachableNets *this)

{
  initializer_list<Network> __l;
  size_type in_RDI;
  long in_FS_OFFSET;
  allocator<Network> *in_stack_ffffffffffffff78;
  allocator<Network> *this_00;
  key_equal *in_stack_ffffffffffffff80;
  hasher *in_stack_ffffffffffffff88;
  iterator in_stack_ffffffffffffffb0;
  undefined8 *puVar1;
  allocator_type *in_stack_ffffffffffffffd0;
  undefined8 local_28;
  undefined4 uStack_20;
  undefined4 local_1c;
  undefined4 uStack_18;
  undefined8 uStack_14;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_ffffffffffffff78);
  uStack_18 = 4;
  uStack_14 = 0x600000005;
  local_28 = 0x100000000;
  uStack_20 = 2;
  local_1c = 3;
  puVar1 = &local_28;
  this_00 = (allocator<Network> *)&stack0xffffffffffffffd5;
  std::allocator<Network>::allocator(in_stack_ffffffffffffff78);
  __l._M_len = (size_type)puVar1;
  __l._M_array = in_stack_ffffffffffffffb0;
  std::unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  ::unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)this_00,__l,in_RDI,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                  in_stack_ffffffffffffffd0);
  std::allocator<Network>::~allocator(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        AssertLockNotHeld(m_mutex);
        LOCK(m_mutex);
        m_reachable.insert(net);
    }